

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O3

TValue * lj_meta_comp(lua_State *L,cTValue *o1,cTValue *o2,int op)

{
  uint32_t uVar1;
  cTValue *pcVar2;
  uint uVar3;
  cTValue *pcVar4;
  TValue *pTVar5;
  ulong uVar6;
  cTValue *ot;
  MMS mm;
  uint uVar7;
  code *pcVar8;
  bool bVar9;
  
  uVar7 = (o1->field_2).it;
  pcVar4 = o1;
  if ((uVar7 == 0xfffffff5) || (pcVar4 = o2, (o2->field_2).it == 0xfffffff5)) {
    pcVar4 = lj_meta_lookup(L,pcVar4,MM_le - ((op & 2U) == 0));
    if ((pcVar4->field_2).it == 0xffffffff) {
LAB_0010ba84:
      lj_err_comp(L,(cTValue *)(ulong)uVar7,o2);
    }
  }
  else {
    if ((o2->field_2).it == 0xfffffffb && uVar7 == 0xfffffffb) {
      uVar3 = lj_str_cmp((GCstr *)(ulong)(o1->u32).lo,(GCstr *)(ulong)(o2->u32).lo);
      uVar7 = (uint)((int)uVar3 < 1);
      if ((op & 2U) == 0) {
        uVar7 = uVar3 >> 0x1f;
      }
      return (TValue *)(ulong)(op & 1U ^ uVar7);
    }
    bVar9 = (op & 2U) == 0;
    mm = bVar9 ^ MM_le;
    pcVar4 = lj_meta_lookup(L,o1,mm);
    uVar1 = (pcVar4->field_2).it;
    pcVar2 = o1;
    while ((o1 = pcVar2, uVar1 == 0xffffffff &&
           (pcVar4 = lj_meta_lookup(L,o2,mm), (pcVar4->field_2).it == 0xffffffff))) {
      if (bVar9) {
        uVar7 = (o1->field_2).it;
        goto LAB_0010ba84;
      }
      op = op ^ 3;
      bVar9 = (op & 2U) == 0;
      mm = bVar9 ^ MM_le;
      pcVar4 = lj_meta_lookup(L,o2,mm);
      uVar1 = (pcVar4->field_2).it;
      pcVar2 = o2;
      o2 = o1;
    }
  }
  uVar6 = (ulong)L->base[-1].u32.lo;
  if (*(char *)(uVar6 + 6) == '\0') {
    pTVar5 = L->base + *(byte *)((ulong)*(uint *)(uVar6 + 0x10) - 0x39);
  }
  else {
    pTVar5 = L->top;
  }
  pcVar8 = lj_cont_condf;
  if ((op & 1U) == 0) {
    pcVar8 = lj_cont_condt;
  }
  pTVar5->u64 = (uint64_t)(pcVar8 + -0x14dad0);
  pTVar5[1] = *pcVar4;
  pTVar5[2] = *o1;
  pTVar5[3] = *o2;
  return pTVar5 + 2;
}

Assistant:

TValue *lj_meta_comp(lua_State *L, cTValue *o1, cTValue *o2, int op)
{
  if (LJ_HASFFI && (tviscdata(o1) || tviscdata(o2))) {
    ASMFunction cont = (op & 1) ? lj_cont_condf : lj_cont_condt;
    MMS mm = (op & 2) ? MM_le : MM_lt;
    cTValue *mo = lj_meta_lookup(L, tviscdata(o1) ? o1 : o2, mm);
    if (LJ_UNLIKELY(tvisnil(mo))) goto err;
    return mmcall(L, cont, mo, o1, o2);
  } else if (LJ_52 || itype(o1) == itype(o2)) {
    /* Never called with two numbers. */
    if (tvisstr(o1) && tvisstr(o2)) {
      int32_t res = lj_str_cmp(strV(o1), strV(o2));
      return (TValue *)(intptr_t)(((op&2) ? res <= 0 : res < 0) ^ (op&1));
    } else {
    trymt:
      while (1) {
	ASMFunction cont = (op & 1) ? lj_cont_condf : lj_cont_condt;
	MMS mm = (op & 2) ? MM_le : MM_lt;
	cTValue *mo = lj_meta_lookup(L, o1, mm);
#if LJ_52
	if (tvisnil(mo) && tvisnil((mo = lj_meta_lookup(L, o2, mm))))
#else
	cTValue *mo2 = lj_meta_lookup(L, o2, mm);
	if (tvisnil(mo) || !lj_obj_equal(mo, mo2))
#endif
	{
	  if (op & 2) {  /* MM_le not found: retry with MM_lt. */
	    cTValue *ot = o1; o1 = o2; o2 = ot;  /* Swap operands. */
	    op ^= 3;  /* Use LT and flip condition. */
	    continue;
	  }
	  goto err;
	}
	return mmcall(L, cont, mo, o1, o2);
      }
    }
  } else if (tvisbool(o1) && tvisbool(o2)) {
    goto trymt;
  } else {
  err:
    lj_err_comp(L, o1, o2);
    return NULL;
  }
}